

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O2

Variant * Jinx::Impl::AsyncCall
                    (Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  pointer pVVar1;
  RuntimeID functionID;
  char *message;
  ScriptIPtr s;
  __shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr<Jinx::IScript> local_48;
  CoroutinePtr local_38;
  Parameters local_28;
  
  std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>((shared_ptr<Jinx::IScript> *)&local_58)
  ;
  pVVar1 = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 == (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl
                .super__Vector_impl_data._M_finish) {
    message = "\'async call\' function invoked with no parameters";
  }
  else {
    if (pVVar1->m_type == Function) {
      std::__shared_ptr<Jinx::IScript,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Jinx::Impl::Script,void>
                ((__shared_ptr<Jinx::IScript,(__gnu_cxx::_Lock_policy)2> *)&local_48,&local_58);
      functionID = Variant::GetFunction
                             ((params->
                              super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>).
                              _M_impl.super__Vector_impl_data._M_start);
      local_28.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_28.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_28.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CreateCoroutine((Jinx *)&local_38,&local_48,functionID,&local_28);
      Variant::Variant(__return_storage_ptr__,&local_38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_38.super___shared_ptr<Jinx::ICoroutine,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::~vector(&local_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_48.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      goto LAB_00121637;
    }
    message = "\'async call\' function requires valid function variable as parameter";
  }
  Script::Error(local_58._M_ptr,message);
  __return_storage_ptr__->m_type = Null;
  Variant::SetNull(__return_storage_ptr__);
LAB_00121637:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant AsyncCall(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (params.empty())
		{
			s->Error("'async call' function invoked with no parameters");
			return nullptr;
		}
		if (!params[0].IsFunction())
		{
			s->Error("'async call' function requires valid function variable as parameter");
			return nullptr;
		}
		return CreateCoroutine(s, params[0].GetFunction(), Parameters());
	}